

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O1

void __thiscall HandDetector::getFingers(HandDetector *this)

{
  Hand *pHVar1;
  Hand *this_00;
  ShortHand lastH;
  ShortHand SStack_68;
  
  this_00 = *(Hand **)this;
  pHVar1 = *(Hand **)(this + 8);
  if (this_00 != pHVar1) {
    do {
      Hand::getSame(&SStack_68,this_00,
                    (vector<ShortHand,_std::allocator<ShortHand>_> *)(this + 0x100));
      Hand::getFingers(this_00,&SStack_68.fingers);
      if (SStack_68.fingers.super__Vector_base<ShortFinger,_std::allocator<ShortFinger>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(SStack_68.fingers.
                        super__Vector_base<ShortFinger,_std::allocator<ShortFinger>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pHVar1);
  }
  checkHands(this);
  return;
}

Assistant:

void HandDetector::getFingers() {
    for (Hand &h : hands) {
        ShortHand lastH = h.getSame(lastHands);
        h.getFingers(lastH.fingers);
    }
    checkHands();
}